

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O1

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  buffer_sequence_iterator_type pcVar1;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  buffer_sequence_iterator_type pcVar5;
  buffer_sequence_iterator_type pcVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  
  if (n < 1) {
    if (n < 0) {
      uVar9 = -n;
      if (this->position_ < uVar9) {
        __assert_fail("position_ >= abs_n && \"iterator out of bounds\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                      ,0x1bd,
                      "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                     );
      }
      uVar8 = this->current_buffer_position_;
      if (uVar8 < uVar9) {
        sVar10 = this->position_;
        pcVar1 = this->begin_;
        pcVar5 = this->current_;
        do {
          uVar9 = uVar9 - uVar8;
          sVar10 = sVar10 - uVar8;
          this->position_ = sVar10;
          pcVar6 = pcVar5;
          if (pcVar5 == pcVar1) {
            if (uVar9 != 0) {
              __assert_fail("abs_n == 0 && \"iterator out of bounds\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                            ,0x1cf,
                            "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                           );
            }
            sVar10 = 0;
            goto LAB_00125d72;
          }
          do {
            if (pcVar6 == pcVar1) goto LAB_00125d57;
            uVar2 = pcVar6[-1].size_;
            pcVar6 = pcVar6 + -1;
          } while (uVar2 == 0);
          pvVar3 = pcVar6->data_;
          this->current_ = pcVar6;
          (this->current_buffer_).data_ = pvVar3;
          (this->current_buffer_).size_ = uVar2;
          this->current_buffer_position_ = uVar2;
          uVar8 = uVar2;
          pcVar5 = pcVar6;
LAB_00125d57:
        } while (uVar8 < uVar9);
      }
      this->position_ = this->position_ - uVar9;
      sVar10 = uVar8 - uVar9;
LAB_00125d72:
      this->current_buffer_position_ = sVar10;
    }
  }
  else {
    pcVar1 = this->end_;
    if (this->current_ == pcVar1) {
      __assert_fail("current_ != end_ && \"iterator out of bounds\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                    ,0x19b,
                    "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                   );
    }
    sVar10 = this->current_buffer_position_;
    sVar7 = this->position_;
    pcVar5 = this->current_;
    do {
      lVar11 = (this->current_buffer_).size_ - sVar10;
      lVar12 = n - lVar11;
      if (n < lVar11) {
        sVar7 = sVar7 + n;
        this->position_ = sVar7;
        sVar10 = sVar10 + n;
        bVar4 = false;
        pcVar6 = pcVar5;
        lVar12 = n;
      }
      else {
        sVar7 = sVar7 + lVar11;
        this->position_ = sVar7;
        pcVar6 = pcVar5 + 1;
        this->current_ = pcVar6;
        if (pcVar6 == pcVar1) {
          if (lVar12 != 0) {
            __assert_fail("n == 0 && \"iterator out of bounds\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                          ,0x1b1,
                          "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                         );
          }
          (this->current_buffer_).data_ = (void *)0x0;
          (this->current_buffer_).size_ = 0;
          sVar10 = 0;
          bVar4 = false;
          lVar12 = 0;
        }
        else {
          sVar10 = pcVar5[1].size_;
          (this->current_buffer_).data_ = pcVar6->data_;
          (this->current_buffer_).size_ = sVar10;
          bVar4 = true;
          sVar10 = 0;
        }
      }
      this->current_buffer_position_ = sVar10;
      pcVar5 = pcVar6;
      n = lVar12;
    } while (bVar4);
  }
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }